

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::InverseDistanceWeighting::~InverseDistanceWeighting
          (InverseDistanceWeighting *this)

{
  ~InverseDistanceWeighting(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

InverseDistanceWeighting::~InverseDistanceWeighting() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.InverseDistanceWeighting)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}